

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

float * stbi__loadf_main(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  int a;
  int b;
  int iVar1;
  uint uVar2;
  float *pfVar3;
  uchar *__ptr;
  long lVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  uchar *puVar8;
  stbi__result_info *in_R9;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  float *pfVar12;
  long in_FS_OFFSET;
  double dVar13;
  
  iVar1 = stbi__hdr_test(s);
  if (iVar1 == 0) {
    iVar1 = req_comp;
    __ptr = stbi__load_and_postprocess_8bit(s,x,y,comp,req_comp);
    if (__ptr == (uchar *)0x0) {
      pcVar5 = "Image not of any known type, or corrupt";
    }
    else {
      a = *x;
      b = *y;
      if (req_comp == 0) {
        req_comp = *comp;
      }
      pfVar3 = (float *)stbi__malloc_mad4(a,b,req_comp,4,iVar1);
      if (pfVar3 != (float *)0x0) {
        uVar2 = req_comp - (uint)((req_comp & 1U) == 0);
        uVar11 = b * a;
        lVar6 = (long)req_comp;
        uVar10 = (ulong)uVar11;
        if (0 < (int)uVar11) {
          uVar7 = 0;
          puVar8 = __ptr;
          pfVar12 = pfVar3;
          do {
            if (0 < (int)uVar2) {
              uVar9 = 0;
              do {
                dVar13 = pow((double)((float)puVar8[uVar9] / 255.0),(double)stbi__l2h_gamma);
                pfVar12[uVar9] = (float)((double)stbi__l2h_scale * dVar13);
                uVar9 = uVar9 + 1;
              } while (uVar2 != uVar9);
            }
            uVar7 = uVar7 + 1;
            pfVar12 = pfVar12 + lVar6;
            puVar8 = puVar8 + lVar6;
          } while (uVar7 != uVar10);
        }
        if ((req_comp & 1U) == 0 && 0 < (int)uVar11) {
          lVar4 = (long)(int)uVar2;
          do {
            pfVar3[lVar4] = (float)__ptr[lVar4] / 255.0;
            lVar4 = lVar4 + lVar6;
            uVar10 = uVar10 - 1;
          } while (uVar10 != 0);
        }
        free(__ptr);
        return pfVar3;
      }
      free(__ptr);
      pcVar5 = "Out of memory";
    }
    *(char **)(in_FS_OFFSET + -0x20) = pcVar5;
    pfVar3 = (float *)0x0;
  }
  else {
    pfVar3 = stbi__hdr_load(s,x,y,comp,req_comp,in_R9);
    if (pfVar3 != (float *)0x0) {
      iVar1 = stbi__vertically_flip_on_load_global;
      if (*(int *)(in_FS_OFFSET + -0x14) != 0) {
        iVar1 = *(int *)(in_FS_OFFSET + -0x18);
      }
      if (iVar1 != 0) {
        if (req_comp == 0) {
          req_comp = *comp;
        }
        stbi__vertical_flip(pfVar3,*x,*y,req_comp << 2);
      }
    }
  }
  return pfVar3;
}

Assistant:

static float *stbi__loadf_main(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *data;
   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      stbi__result_info ri;
      float *hdr_data = stbi__hdr_load(s,x,y,comp,req_comp, &ri);
      if (hdr_data)
         stbi__float_postprocess(hdr_data,x,y,comp,req_comp);
      return hdr_data;
   }
   #endif
   data = stbi__load_and_postprocess_8bit(s, x, y, comp, req_comp);
   if (data)
      return stbi__ldr_to_hdr(data, *x, *y, req_comp ? req_comp : *comp);
   return stbi__errpf("unknown image type", "Image not of any known type, or corrupt");
}